

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O3

Am_Method_Wrapper * __thiscall Am_Value::operator_cast_to_Am_Method_Wrapper_(Am_Value *this)

{
  ushort uVar1;
  
  uVar1 = this->type;
  if ((uVar1 & 0x7000) == 0x3000) {
    return (Am_Method_Wrapper *)(this->value).wrapper_value;
  }
  if (uVar1 < 0xb) {
    if ((0x60cU >> (uVar1 & 0x1f) & 1) == 0) {
      if (uVar1 != 1) goto LAB_00227515;
    }
    else if ((this->value).wrapper_value != (Am_Wrapper *)0x0) goto LAB_00227515;
    return (Am_Method_Wrapper *)0x0;
  }
LAB_00227515:
  type_error("Am_Method_Wrapper*",this);
}

Assistant:

Am_Value::operator Am_Method_Wrapper *() const
{
  if (Am_Type_Class(type) == Am_METHOD)
    return value.method_value;
  switch (type) {
  case Am_ZERO:
    return nullptr;
  case Am_PROC:
  case Am_INT:
  case Am_LONG:
  case Am_VOIDPTR:
    if (!value.voidptr_value)
      return nullptr;
  default:
    type_error("Am_Method_Wrapper*", *this);
    return nullptr;
  }
}